

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 != 0x73) {
    if (iVar1 == 0x70) {
      arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
      ::cstring_spec_handler::on_pointer(handler);
      return;
    }
    if (iVar1 != 0) {
      error_handler::on_error((error_handler *)handler,"invalid type specifier");
      return;
    }
  }
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::cstring_spec_handler::on_string(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler &&handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}